

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O1

Bool mainGtU(UInt32 i1,UInt32 i2,UChar *block,UInt16 *quadrant,UInt32 nblock,Int32 *budget)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  UInt32 UVar4;
  bool bVar5;
  bool bVar6;
  
  bVar5 = block[i1] < block[i2];
  bVar6 = block[i1] == block[i2];
  if (bVar6) {
    bVar5 = block[i1 + 1] < block[i2 + 1];
    bVar6 = block[i1 + 1] == block[i2 + 1];
    if (bVar6) {
      bVar5 = block[i1 + 2] < block[i2 + 2];
      bVar6 = block[i1 + 2] == block[i2 + 2];
      if (bVar6) {
        bVar5 = block[i1 + 3] < block[i2 + 3];
        bVar6 = block[i1 + 3] == block[i2 + 3];
        if (bVar6) {
          bVar5 = block[i1 + 4] < block[i2 + 4];
          bVar6 = block[i1 + 4] == block[i2 + 4];
          if (bVar6) {
            bVar5 = block[i1 + 5] < block[i2 + 5];
            bVar6 = block[i1 + 5] == block[i2 + 5];
            if (bVar6) {
              bVar5 = block[i1 + 6] < block[i2 + 6];
              bVar6 = block[i1 + 6] == block[i2 + 6];
              if (bVar6) {
                bVar5 = block[i1 + 7] < block[i2 + 7];
                bVar6 = block[i1 + 7] == block[i2 + 7];
                if (bVar6) {
                  bVar5 = block[i1 + 8] < block[i2 + 8];
                  bVar6 = block[i1 + 8] == block[i2 + 8];
                  if (bVar6) {
                    bVar5 = block[i1 + 9] < block[i2 + 9];
                    bVar6 = block[i1 + 9] == block[i2 + 9];
                    if (bVar6) {
                      bVar5 = block[i1 + 10] < block[i2 + 10];
                      bVar6 = block[i1 + 10] == block[i2 + 10];
                      if (bVar6) {
                        bVar5 = block[i1 + 0xb] < block[i2 + 0xb];
                        bVar6 = block[i1 + 0xb] == block[i2 + 0xb];
                        if (bVar6) {
                          uVar2 = i1 + 0xc;
                          uVar1 = i2 + 0xc;
                          iVar3 = nblock + 0x10;
                          while( true ) {
                            bVar5 = block[uVar2] < block[uVar1];
                            bVar6 = block[uVar2] == block[uVar1];
                            if (!bVar6) break;
                            bVar5 = quadrant[uVar2] < quadrant[uVar1];
                            bVar6 = quadrant[uVar2] == quadrant[uVar1];
                            if (!bVar6) break;
                            bVar5 = block[uVar2 + 1] < block[uVar1 + 1];
                            bVar6 = block[uVar2 + 1] == block[uVar1 + 1];
                            if (!bVar6) break;
                            bVar5 = quadrant[uVar2 + 1] < quadrant[uVar1 + 1];
                            bVar6 = quadrant[uVar2 + 1] == quadrant[uVar1 + 1];
                            if (!bVar6) break;
                            bVar5 = block[uVar2 + 2] < block[uVar1 + 2];
                            bVar6 = block[uVar2 + 2] == block[uVar1 + 2];
                            if (!bVar6) break;
                            bVar5 = quadrant[uVar2 + 2] < quadrant[uVar1 + 2];
                            bVar6 = quadrant[uVar2 + 2] == quadrant[uVar1 + 2];
                            if (!bVar6) break;
                            bVar5 = block[uVar2 + 3] < block[uVar1 + 3];
                            bVar6 = block[uVar2 + 3] == block[uVar1 + 3];
                            if (!bVar6) break;
                            bVar5 = quadrant[uVar2 + 3] < quadrant[uVar1 + 3];
                            bVar6 = quadrant[uVar2 + 3] == quadrant[uVar1 + 3];
                            if (!bVar6) break;
                            bVar5 = block[uVar2 + 4] < block[uVar1 + 4];
                            bVar6 = block[uVar2 + 4] == block[uVar1 + 4];
                            if (!bVar6) break;
                            bVar5 = quadrant[uVar2 + 4] < quadrant[uVar1 + 4];
                            bVar6 = quadrant[uVar2 + 4] == quadrant[uVar1 + 4];
                            if (!bVar6) break;
                            bVar5 = block[uVar2 + 5] < block[uVar1 + 5];
                            bVar6 = block[uVar2 + 5] == block[uVar1 + 5];
                            if (!bVar6) break;
                            bVar5 = quadrant[uVar2 + 5] < quadrant[uVar1 + 5];
                            bVar6 = quadrant[uVar2 + 5] == quadrant[uVar1 + 5];
                            if (!bVar6) break;
                            bVar5 = block[uVar2 + 6] < block[uVar1 + 6];
                            bVar6 = block[uVar2 + 6] == block[uVar1 + 6];
                            if (!bVar6) break;
                            bVar5 = quadrant[uVar2 + 6] < quadrant[uVar1 + 6];
                            bVar6 = quadrant[uVar2 + 6] == quadrant[uVar1 + 6];
                            if (!bVar6) break;
                            bVar5 = block[uVar2 + 7] < block[uVar1 + 7];
                            bVar6 = block[uVar2 + 7] == block[uVar1 + 7];
                            if (!bVar6) break;
                            bVar5 = quadrant[uVar2 + 7] < quadrant[uVar1 + 7];
                            bVar6 = quadrant[uVar2 + 7] == quadrant[uVar1 + 7];
                            if (!bVar6) break;
                            UVar4 = nblock;
                            if (uVar2 + 8 < nblock) {
                              UVar4 = 0;
                            }
                            uVar2 = (uVar2 + 8) - UVar4;
                            UVar4 = nblock;
                            if (uVar1 + 8 < nblock) {
                              UVar4 = 0;
                            }
                            *budget = *budget + -1;
                            uVar1 = (uVar1 + 8) - UVar4;
                            iVar3 = iVar3 + -8;
                            if (iVar3 < 8) {
                              return '\0';
                            }
                          }
                          return !bVar5 && !bVar6;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return !bVar5 && !bVar6;
}

Assistant:

static
__inline__
Bool mainGtU ( UInt32  i1, 
               UInt32  i2,
               UChar*  block, 
               UInt16* quadrant,
               UInt32  nblock,
               Int32*  budget )
{
   Int32  k;
   UChar  c1, c2;
   UInt16 s1, s2;

   AssertD ( i1 != i2, "mainGtU" );
   /* 1 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 2 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 3 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 4 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 5 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 6 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 7 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 8 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 9 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 10 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 11 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 12 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;

   k = nblock + 8;

   do {
      /* 1 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 2 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 3 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 4 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 5 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 6 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 7 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 8 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;

      if (i1 >= nblock) i1 -= nblock;
      if (i2 >= nblock) i2 -= nblock;

      k -= 8;
      (*budget)--;
   }
      while (k >= 0);

   return False;
}